

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_misc.cpp
# Opt level: O1

spv_result_t spvtools::val::MiscPass(ValidationState_t *_,Instruction *inst)

{
  size_t *psVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint scope;
  spv_result_t sVar6;
  uint32_t uVar7;
  Function *pFVar8;
  _Node *p_Var9;
  DiagnosticStream *pDVar10;
  long lVar11;
  char *pcVar12;
  string local_248;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [28];
  spv_result_t local_38;
  
  if ((inst->inst_).opcode == 1) {
    bVar3 = ValidationState_t::IsVoidType(_,(inst->inst_).type_id);
    if (bVar3) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar12 = "Cannot create undefined values with void type";
      lVar11 = 0x2d;
LAB_0019b16e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar12,lVar11);
      sVar6 = local_38;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
    else {
      bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      sVar6 = SPV_SUCCESS;
      if (((bVar3) &&
          (bVar3 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id),
          bVar3)) &&
         (bVar3 = ValidationState_t::IsPointerType(_,(inst->inst_).type_id), sVar6 = SPV_SUCCESS,
         !bVar3)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar12 = "Cannot create undefined values with 8- or 16-bit types";
        lVar11 = 0x36;
        goto LAB_0019b16e;
      }
    }
    if (sVar6 != SPV_SUCCESS) {
      return sVar6;
    }
  }
  uVar2 = (inst->inst_).opcode;
  if (0x1504 < uVar2) {
    if (uVar2 == 0x1505) {
      uVar7 = (inst->inst_).type_id;
      pFVar8 = ValidationState_t::function(_,inst->function_->id_);
      local_208._0_8_ = local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_208,"OpIsHelperInvocationEXT requires Fragment execution model","")
      ;
      Function::RegisterExecutionModelLimitation(pFVar8,ExecutionModelFragment,(string *)local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != local_1f8) {
        operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
      }
      bVar3 = ValidationState_t::IsBoolScalarType(_,uVar7);
      if (bVar3) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Expected bool scalar type as Result Type: ",0x2a);
      local_248._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
      pDVar10 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_248);
      sVar6 = pDVar10->error_;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return sVar6;
    }
    if (uVar2 == 0x15fe) {
      uVar7 = ValidationState_t::GetOperandTypeId(_,inst,0);
      if ((uVar7 == 0) ||
         (bVar3 = ValidationState_t::IsBoolScalarType(_,uVar7), sVar6 = SPV_SUCCESS, !bVar3)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Value operand of OpAssumeTrueKHR must be a boolean scalar",
                   0x39);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        sVar6 = local_38;
      }
    }
    else {
      if (uVar2 != 0x15ff) {
        return SPV_SUCCESS;
      }
      uVar7 = (inst->inst_).type_id;
      bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,uVar7);
      if ((bVar3) || (bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,uVar7), bVar3)) {
        uVar5 = ValidationState_t::GetOperandTypeId(_,inst,2);
        if (uVar5 == uVar7) {
          uVar5 = ValidationState_t::GetOperandTypeId(_,inst,3);
          sVar6 = SPV_SUCCESS;
          if (uVar5 == uVar7) goto joined_r0x0019b548;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar12 = "Type of ExpectedValue operand of OpExpectKHR does not match the result type ";
          lVar11 = 0x4c;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar12 = "Type of Value operand of OpExpectKHR does not match the result type ";
          lVar11 = 0x44;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar12 = "Result of OpExpectKHR must be a scalar or vector of integer type or boolean type"
        ;
        lVar11 = 0x50;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar12,lVar11);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      sVar6 = local_38;
    }
    goto joined_r0x0019b548;
  }
  if (uVar2 - 0x14f4 < 2) {
    pFVar8 = ValidationState_t::function(_,inst->function_->id_);
    local_208._0_8_ = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,
               "OpBeginInvocationInterlockEXT/OpEndInvocationInterlockEXT require Fragment execution model"
               ,"");
    Function::RegisterExecutionModelLimitation(pFVar8,ExecutionModelFragment,(string *)local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._0_8_ != local_1f8) {
      operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
    }
    pFVar8 = ValidationState_t::function(_,inst->function_->id_);
    local_228._M_unused._M_object = (void *)0x0;
    local_228._8_8_ = 0;
    local_210 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_misc.cpp:136:32)>
                ::_M_invoke;
    local_218 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_misc.cpp:136:32)>
                ::_M_manager;
    p_Var9 = std::__cxx11::
             list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
             ::
             _M_create_node<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>const&>
                       ((list<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>,std::allocator<std::function<bool(spvtools::val::ValidationState_t_const&,spvtools::val::Function_const*,std::__cxx11::string*)>>>
                         *)&pFVar8->limitations_,
                        (function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                         *)&local_228);
    std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
    psVar1 = &(pFVar8->limitations_).
              super__List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_218 == (code *)0x0) {
      return SPV_SUCCESS;
    }
    (*local_218)(&local_228,&local_228,__destroy_functor);
    return SPV_SUCCESS;
  }
  if (uVar2 != 0x13c0) {
    if (uVar2 != 0x1504) {
      return SPV_SUCCESS;
    }
    pFVar8 = ValidationState_t::function(_,inst->function_->id_);
    local_208._0_8_ = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,"OpDemoteToHelperInvocationEXT requires Fragment execution model"
               ,"");
    Function::RegisterExecutionModelLimitation(pFVar8,ExecutionModelFragment,(string *)local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._0_8_ == local_1f8) {
      return SPV_SUCCESS;
    }
    operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
    return SPV_SUCCESS;
  }
  scope = Instruction::GetOperandAs<unsigned_int>(inst,2);
  sVar6 = ValidateScope(_,inst,scope);
  if (sVar6 != SPV_SUCCESS) goto joined_r0x0019b548;
  ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,scope);
  if (local_208[4] == true) {
    bVar3 = spvIsVulkanEnv(_->context_->target_env);
    if (bVar3) {
      bVar3 = true;
      if ((local_208._0_4_ & 0xfffffffd) != 1) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x122c,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Scope must be Subgroup or Device",0x20);
        sVar6 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
LAB_0019b70e:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        bVar3 = false;
      }
    }
    else {
      bVar4 = spvIsOpenCLEnv(_->context_->target_env);
      bVar3 = true;
      if (local_208._0_4_ - 4 < 0xfffffffd && bVar4) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Scope must be Subgroup, Workgroup, or Device",0x2c);
        sVar6 = local_38;
        goto LAB_0019b70e;
      }
    }
    if (!bVar3) goto joined_r0x0019b548;
  }
  bVar3 = ValidationState_t::IsUnsigned64BitHandle(_,(inst->inst_).type_id);
  sVar6 = SPV_SUCCESS;
  if (!bVar3) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               "Expected Value to be a vector of two components of unsigned integer or 64bit unsigned integer"
               ,0x5d);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar6 = local_38;
  }
joined_r0x0019b548:
  if (sVar6 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar6;
}

Assistant:

spv_result_t MiscPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpUndef:
      if (auto error = ValidateUndef(_, inst)) return error;
      break;
    default:
      break;
  }
  switch (inst->opcode()) {
    case spv::Op::OpBeginInvocationInterlockEXT:
    case spv::Op::OpEndInvocationInterlockEXT:
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Fragment,
              "OpBeginInvocationInterlockEXT/OpEndInvocationInterlockEXT "
              "require Fragment execution model");

      _.function(inst->function()->id())
          ->RegisterLimitation([](const ValidationState_t& state,
                                  const Function* entry_point,
                                  std::string* message) {
            const auto* execution_modes =
                state.GetExecutionModes(entry_point->id());

            auto find_interlock = [](const spv::ExecutionMode& mode) {
              switch (mode) {
                case spv::ExecutionMode::PixelInterlockOrderedEXT:
                case spv::ExecutionMode::PixelInterlockUnorderedEXT:
                case spv::ExecutionMode::SampleInterlockOrderedEXT:
                case spv::ExecutionMode::SampleInterlockUnorderedEXT:
                case spv::ExecutionMode::ShadingRateInterlockOrderedEXT:
                case spv::ExecutionMode::ShadingRateInterlockUnorderedEXT:
                  return true;
                default:
                  return false;
              }
            };

            bool found = false;
            if (execution_modes) {
              auto i = std::find_if(execution_modes->begin(),
                                    execution_modes->end(), find_interlock);
              found = (i != execution_modes->end());
            }

            if (!found) {
              *message =
                  "OpBeginInvocationInterlockEXT/OpEndInvocationInterlockEXT "
                  "require a fragment shader interlock execution mode.";
              return false;
            }
            return true;
          });
      break;
    case spv::Op::OpDemoteToHelperInvocationEXT:
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Fragment,
              "OpDemoteToHelperInvocationEXT requires Fragment execution "
              "model");
      break;
    case spv::Op::OpIsHelperInvocationEXT: {
      const uint32_t result_type = inst->type_id();
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Fragment,
              "OpIsHelperInvocationEXT requires Fragment execution model");
      if (!_.IsBoolScalarType(result_type))
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected bool scalar type as Result Type: "
               << spvOpcodeString(inst->opcode());
      break;
    }
    case spv::Op::OpReadClockKHR:
      if (auto error = ValidateShaderClock(_, inst)) {
        return error;
      }
      break;
    case spv::Op::OpAssumeTrueKHR:
      if (auto error = ValidateAssumeTrue(_, inst)) {
        return error;
      }
      break;
    case spv::Op::OpExpectKHR:
      if (auto error = ValidateExpect(_, inst)) {
        return error;
      }
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}